

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGenerator::SelectMakeProgram
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *inMakeProgram,
          string *makeDefault)

{
  cmake *this_00;
  string_view sVar1;
  bool bVar2;
  string *psVar3;
  ulong uVar4;
  allocator<char> local_79;
  string local_78;
  cmValue local_58;
  cmValue makeProgramCSTR;
  string *makeDefault_local;
  string *inMakeProgram_local;
  cmGlobalGenerator *this_local;
  string *makeProgram;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)inMakeProgram);
  sVar1 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)__return_storage_ptr__)
  ;
  bVar2 = cmIsOff(sVar1);
  if (bVar2) {
    this_00 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_MAKE_PROGRAM",&local_79);
    local_58 = cmake::GetCacheDefinition(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    bVar2 = cmValue::IsOff(&local_58);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)makeDefault);
    }
    else {
      psVar3 = cmValue::operator*[abi_cxx11_(&local_58);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar3);
    }
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)__return_storage_ptr__);
    bVar2 = cmIsOff(sVar1);
    if ((bVar2) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,"CMAKE_MAKE_PROGRAM-NOTFOUND");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::SelectMakeProgram(
  const std::string& inMakeProgram, const std::string& makeDefault) const
{
  std::string makeProgram = inMakeProgram;
  if (cmIsOff(makeProgram)) {
    cmValue makeProgramCSTR =
      this->CMakeInstance->GetCacheDefinition("CMAKE_MAKE_PROGRAM");
    if (makeProgramCSTR.IsOff()) {
      makeProgram = makeDefault;
    } else {
      makeProgram = *makeProgramCSTR;
    }
    if (cmIsOff(makeProgram) && !makeProgram.empty()) {
      makeProgram = "CMAKE_MAKE_PROGRAM-NOTFOUND";
    }
  }
  return makeProgram;
}